

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<cv::Mat> *
testing::internal::ActionResultHolder<cv::Mat>::PerformAction<cv::Mat(cv::Mat,cv::Rect_<int>)>
          (Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *action,ArgumentTuple *args)

{
  ActionResultHolder<cv::Mat> *pAVar1;
  Mat local_e0 [96];
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)> local_80 [6];
  
  pAVar1 = (ActionResultHolder<cv::Mat> *)operator_new(0x68);
  Action<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::Perform(local_80,(ArgumentTuple *)action);
  cv::Mat::Mat(local_e0,(Mat *)local_80);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00181668;
  cv::Mat::Mat(&(pAVar1->result_).value_,local_e0);
  cv::Mat::~Mat(local_e0);
  cv::Mat::~Mat((Mat *)local_80);
  return pAVar1;
}

Assistant:

static ActionResultHolder*
  PerformAction(const Action<F>& action,
                const typename Function<F>::ArgumentTuple& args) {
    return new ActionResultHolder(Wrapper(action.Perform(args)));
  }